

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::LSTMParams::ByteSizeLong(LSTMParams *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 6;
  if (this->cellclipthreshold_ == 0.0) {
    sVar3 = 0;
  }
  sVar2 = sVar3 + 2;
  if (this->sequenceoutput_ == false) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 3;
  if (this->hasbiasvectors_ == false) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 3;
  if (this->forgetbias_ == false) {
    sVar2 = sVar3;
  }
  sVar3 = sVar2 + 3;
  if (this->haspeepholevectors_ == false) {
    sVar3 = sVar2;
  }
  sVar2 = sVar3 + 3;
  if (this->coupledinputandforgetgate_ == false) {
    sVar2 = sVar3;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t LSTMParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LSTMParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // float cellClipThreshold = 60;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_cellclipthreshold = this->_internal_cellclipthreshold();
  uint32_t raw_cellclipthreshold;
  memcpy(&raw_cellclipthreshold, &tmp_cellclipthreshold, sizeof(tmp_cellclipthreshold));
  if (raw_cellclipthreshold != 0) {
    total_size += 2 + 4;
  }

  // bool sequenceOutput = 10;
  if (this->_internal_sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->_internal_hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool forgetBias = 30;
  if (this->_internal_forgetbias() != 0) {
    total_size += 2 + 1;
  }

  // bool hasPeepholeVectors = 40;
  if (this->_internal_haspeepholevectors() != 0) {
    total_size += 2 + 1;
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->_internal_coupledinputandforgetgate() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}